

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeAssembler_allocaWithValue
          (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler,
          sysbvm_tuple_t result,sysbvm_tuple_t pointerLikeType,sysbvm_tuple_t value)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t instruction;
  sysbvm_tuple_t operands;
  sysbvm_tuple_t value_local;
  sysbvm_tuple_t pointerLikeType_local;
  sysbvm_tuple_t result_local;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_array_create(context,3);
  sysbvm_array_atPut(sVar1,0,result);
  sysbvm_array_atPut(sVar1,1,pointerLikeType);
  sysbvm_array_atPut(sVar1,2,value);
  sVar1 = sysbvm_functionBytecodeAssemblerInstruction_create(context,'0',sVar1);
  sysbvm_functionBytecodeAssembler_addInstruction(assembler,sVar1);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeAssembler_allocaWithValue(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler, sysbvm_tuple_t result, sysbvm_tuple_t pointerLikeType, sysbvm_tuple_t value)
{
    sysbvm_tuple_t operands = sysbvm_array_create(context, 3);
    sysbvm_array_atPut(operands, 0, result);
    sysbvm_array_atPut(operands, 1, pointerLikeType);
    sysbvm_array_atPut(operands, 2, value);

    sysbvm_tuple_t instruction = sysbvm_functionBytecodeAssemblerInstruction_create(context, SYSBVM_OPCODE_ALLOCA_WITH_VALUE, operands);
    sysbvm_functionBytecodeAssembler_addInstruction(assembler, instruction);
    return instruction;
}